

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboInvalidateTests.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Functional::InvalidateFboTargetCase::render(InvalidateFboTargetCase *this,Surface *dst)

{
  ContextWrapper *this_00;
  deUint32 dVar1;
  deUint32 *pdVar2;
  int i;
  deUint32 dVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  _Var7;
  Context *pCVar8;
  int i_1;
  deUint32 *attachments;
  ulong uVar9;
  bool bVar10;
  uint target;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  deUint32 depthStencilRbo;
  deUint32 fbo;
  deUint32 colorRbo;
  Vector<float,_4> res_1;
  Vector<float,_4> res_2;
  float local_1f8 [2];
  undefined1 *puStack_1f0;
  Vec4 cScale;
  TextureFormat colorFmt;
  TextureFormatInfo colorFmtInfo;
  FlatColorShader flatShader;
  
  colorFmt = glu::mapGLInternalFormat(0x8058);
  tcu::getTextureFormatInfo(&colorFmtInfo,&colorFmt);
  cScale.m_data[0] = 0.0;
  cScale.m_data[1] = 0.0;
  cScale.m_data[2] = 0.0;
  cScale.m_data[3] = 0.0;
  lVar6 = 0;
  do {
    cScale.m_data[lVar6] = colorFmtInfo.valueMax.m_data[lVar6] - colorFmtInfo.valueMin.m_data[lVar6]
    ;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 4);
  dVar3 = this->m_boundTarget;
  bVar10 = true;
  if (dVar3 != 0x8d40) {
    bVar10 = this->m_invalidateTarget == dVar3 ||
             dVar3 == 0x8ca9 && this->m_invalidateTarget == 0x8d40;
  }
  if (bVar10) {
    flatShader.super_ShaderProgram.super_VertexShader._vptr_VertexShader._0_4_ = 0x8ce0;
    _Var7 = std::
            __find_if<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_equals_val<unsigned_int_const>>
                      ((this->m_invalidateAttachments).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_start,
                       (this->m_invalidateAttachments).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_finish);
    bVar11 = _Var7._M_current !=
             (this->m_invalidateAttachments).
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    flatShader.super_ShaderProgram.super_VertexShader._vptr_VertexShader._0_4_ = 0x8d00;
    _Var7 = std::
            __find_if<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_equals_val<unsigned_int_const>>
                      ((this->m_invalidateAttachments).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_start,
                       (this->m_invalidateAttachments).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_finish);
    bVar12 = true;
    if (_Var7._M_current ==
        (this->m_invalidateAttachments).
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      flatShader.super_ShaderProgram.super_VertexShader._vptr_VertexShader._0_4_ = 0x821a;
      _Var7 = std::
              __find_if<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_equals_val<unsigned_int_const>>
                        ((this->m_invalidateAttachments).
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_start);
      bVar12 = _Var7._M_current !=
               (this->m_invalidateAttachments).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish;
    }
  }
  else {
    bVar11 = false;
    bVar12 = false;
  }
  bVar13 = false;
  if (bVar10) {
    flatShader.super_ShaderProgram.super_VertexShader._vptr_VertexShader._0_4_ = 0x8d20;
    _Var7 = std::
            __find_if<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_equals_val<unsigned_int_const>>
                      ((this->m_invalidateAttachments).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_start,
                       (this->m_invalidateAttachments).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_finish);
    bVar13 = true;
    if (_Var7._M_current ==
        (this->m_invalidateAttachments).
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      flatShader.super_ShaderProgram.super_VertexShader._vptr_VertexShader._0_4_ = 0x821a;
      _Var7 = std::
              __find_if<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_equals_val<unsigned_int_const>>
                        ((this->m_invalidateAttachments).
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_start);
      bVar13 = _Var7._M_current !=
               (this->m_invalidateAttachments).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish;
    }
  }
  fbo = 0;
  colorRbo = 0;
  depthStencilRbo = 0;
  FboTestUtil::FlatColorShader::FlatColorShader(&flatShader,TYPE_FLOAT_VEC4);
  this_00 = &(this->super_FboTestCase).super_ContextWrapper;
  pCVar8 = sglr::ContextWrapper::getCurrentContext(this_00);
  dVar3 = (*pCVar8->_vptr_Context[0x75])(pCVar8,&flatShader);
  sglr::ContextWrapper::glGenRenderbuffers(this_00,1,&colorRbo);
  sglr::ContextWrapper::glBindRenderbuffer(this_00,0x8d41,colorRbo);
  iVar4 = sglr::ContextWrapper::getWidth(this_00);
  iVar5 = sglr::ContextWrapper::getHeight(this_00);
  sglr::ContextWrapper::glRenderbufferStorage(this_00,0x8d41,0x8058,iVar4,iVar5);
  sglr::ContextWrapper::glGenRenderbuffers(this_00,1,&depthStencilRbo);
  sglr::ContextWrapper::glBindRenderbuffer(this_00,0x8d41,depthStencilRbo);
  iVar4 = sglr::ContextWrapper::getWidth(this_00);
  iVar5 = sglr::ContextWrapper::getHeight(this_00);
  sglr::ContextWrapper::glRenderbufferStorage(this_00,0x8d41,0x88f0,iVar4,iVar5);
  sglr::ContextWrapper::glGenFramebuffers(this_00,1,&fbo);
  sglr::ContextWrapper::glBindFramebuffer(this_00,0x8d40,fbo);
  sglr::ContextWrapper::glFramebufferRenderbuffer(this_00,0x8d40,0x8ce0,0x8d41,colorRbo);
  sglr::ContextWrapper::glFramebufferRenderbuffer(this_00,0x8d40,0x8d00,0x8d41,depthStencilRbo);
  sglr::ContextWrapper::glFramebufferRenderbuffer(this_00,0x8d40,0x8d20,0x8d41,depthStencilRbo);
  FboTestCase::checkFramebufferStatus(&this->super_FboTestCase,0x8d40);
  sglr::ContextWrapper::glClearColor(this_00,0.0,0.0,0.0,1.0);
  sglr::ContextWrapper::glClear(this_00,0x4500);
  sglr::ContextWrapper::glEnable(this_00,0xb71);
  sglr::ContextWrapper::glEnable(this_00,0xb90);
  sglr::ContextWrapper::glStencilOp(this_00,0x1e00,0x1e00,0x1e01);
  sglr::ContextWrapper::glStencilFunc(this_00,0x207,1,0xff);
  pCVar8 = sglr::ContextWrapper::getCurrentContext(this_00);
  local_1f8[0] = 1.0;
  local_1f8[1] = 0.0;
  puStack_1f0 = (undefined1 *)0x3f80000000000000;
  res_1.m_data[0] = 0.0;
  res_1.m_data[1] = 0.0;
  res_1.m_data[2] = 0.0;
  res_1.m_data[3] = 0.0;
  lVar6 = 0;
  do {
    res_1.m_data[lVar6] = local_1f8[lVar6] * cScale.m_data[lVar6];
    lVar6 = lVar6 + 1;
  } while (lVar6 != 4);
  res_2.m_data[0] = 0.0;
  res_2.m_data[1] = 0.0;
  res_2.m_data[2] = 0.0;
  res_2.m_data[3] = 0.0;
  lVar6 = 0;
  do {
    res_2.m_data[lVar6] = res_1.m_data[lVar6] + colorFmtInfo.valueMin.m_data[lVar6];
    lVar6 = lVar6 + 1;
  } while (lVar6 != 4);
  FboTestUtil::FlatColorShader::setColor(&flatShader,pCVar8,dVar3,&res_2);
  pCVar8 = sglr::ContextWrapper::getCurrentContext(this_00);
  res_2.m_data[0] = -1.0;
  res_2.m_data[1] = -1.0;
  res_2.m_data[2] = -1.0;
  res_1.m_data._0_8_ = &DAT_3f8000003f800000;
  res_1.m_data[2] = 1.0;
  sglr::drawQuad(pCVar8,dVar3,(Vec3 *)&res_2,(Vec3 *)&res_1);
  dVar1 = this->m_boundTarget;
  if (dVar1 != 0x8d40) {
    res_2.m_data._0_8_ = res_2.m_data._0_8_ & 0xffffffff00000000;
    res_1.m_data._0_8_ = res_1.m_data._0_8_ & 0xffffffff00000000;
    sglr::ContextWrapper::glGenRenderbuffers(this_00,1,(deUint32 *)&res_1);
    sglr::ContextWrapper::glBindRenderbuffer(this_00,0x8d41,(deUint32)res_1.m_data[0]);
    sglr::ContextWrapper::glRenderbufferStorage(this_00,0x8d41,0x8058,0x40,0x40);
    sglr::ContextWrapper::glGenFramebuffers(this_00,1,(deUint32 *)&res_2);
    target = dVar1 == 0x8ca9 ^ 0x8ca9;
    sglr::ContextWrapper::glBindFramebuffer(this_00,target,(deUint32)res_2.m_data[0]);
    sglr::ContextWrapper::glFramebufferRenderbuffer
              (this_00,target,0x8ce0,0x8d41,(deUint32)res_1.m_data[0]);
    sglr::ContextWrapper::glBindFramebuffer(this_00,this->m_boundTarget,fbo);
  }
  pdVar2 = (this->m_invalidateAttachments).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar9 = (long)(this->m_invalidateAttachments).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)pdVar2;
  attachments = (deUint32 *)0x0;
  if (uVar9 != 0) {
    attachments = pdVar2;
  }
  sglr::ContextWrapper::glInvalidateFramebuffer
            (this_00,this->m_invalidateTarget,(int)(uVar9 >> 2),attachments);
  if (this->m_boundTarget != 0x8d40) {
    sglr::ContextWrapper::glBindFramebuffer(this_00,0x8d40,fbo);
  }
  if (bVar11) {
    sglr::ContextWrapper::glDisable(this_00,0xb71);
    sglr::ContextWrapper::glDisable(this_00,0xb90);
    pCVar8 = sglr::ContextWrapper::getCurrentContext(this_00);
    local_1f8[0] = 0.0;
    local_1f8[1] = 1.0;
    puStack_1f0 = (undefined1 *)0x3f80000000000000;
    res_1.m_data[0] = 0.0;
    res_1.m_data[1] = 0.0;
    res_1.m_data[2] = 0.0;
    res_1.m_data[3] = 0.0;
    lVar6 = 0;
    do {
      res_1.m_data[lVar6] = local_1f8[lVar6] * cScale.m_data[lVar6];
      lVar6 = lVar6 + 1;
    } while (lVar6 != 4);
    res_2.m_data[0] = 0.0;
    res_2.m_data[1] = 0.0;
    res_2.m_data[2] = 0.0;
    res_2.m_data[3] = 0.0;
    lVar6 = 0;
    do {
      res_2.m_data[lVar6] = res_1.m_data[lVar6] + colorFmtInfo.valueMin.m_data[lVar6];
      lVar6 = lVar6 + 1;
    } while (lVar6 != 4);
    FboTestUtil::FlatColorShader::setColor(&flatShader,pCVar8,dVar3,&res_2);
    pCVar8 = sglr::ContextWrapper::getCurrentContext(this_00);
    res_2.m_data[0] = -1.0;
    res_2.m_data[1] = -1.0;
    res_2.m_data._8_8_ = res_2.m_data._8_8_ & 0xffffffff00000000;
    res_1.m_data._0_8_ = &DAT_3f8000003f800000;
    res_1.m_data._8_8_ = res_1.m_data._8_8_ & 0xffffffff00000000;
    sglr::drawQuad(pCVar8,dVar3,(Vec3 *)&res_2,(Vec3 *)&res_1);
    sglr::ContextWrapper::glEnable(this_00,0xb71);
    sglr::ContextWrapper::glEnable(this_00,0xb90);
  }
  if (bVar12) {
    sglr::ContextWrapper::glDepthFunc(this_00,0x207);
  }
  if (!bVar13) {
    sglr::ContextWrapper::glStencilFunc(this_00,0x202,1,0xff);
  }
  sglr::ContextWrapper::glEnable(this_00,0xbe2);
  sglr::ContextWrapper::glBlendFunc(this_00,1,1);
  sglr::ContextWrapper::glBlendEquation(this_00,0x8006);
  pCVar8 = sglr::ContextWrapper::getCurrentContext(this_00);
  local_1f8[0] = 0.0;
  local_1f8[1] = 0.0;
  puStack_1f0 = &DAT_3f8000003f800000;
  res_1.m_data[0] = 0.0;
  res_1.m_data[1] = 0.0;
  res_1.m_data[2] = 0.0;
  res_1.m_data[3] = 0.0;
  lVar6 = 0;
  do {
    res_1.m_data[lVar6] = local_1f8[lVar6] * cScale.m_data[lVar6];
    lVar6 = lVar6 + 1;
  } while (lVar6 != 4);
  res_2.m_data[0] = 0.0;
  res_2.m_data[1] = 0.0;
  res_2.m_data[2] = 0.0;
  res_2.m_data[3] = 0.0;
  lVar6 = 0;
  do {
    res_2.m_data[lVar6] = res_1.m_data[lVar6] + colorFmtInfo.valueMin.m_data[lVar6];
    lVar6 = lVar6 + 1;
  } while (lVar6 != 4);
  FboTestUtil::FlatColorShader::setColor(&flatShader,pCVar8,dVar3,&res_2);
  pCVar8 = sglr::ContextWrapper::getCurrentContext(this_00);
  res_2.m_data[0] = -1.0;
  res_2.m_data[1] = -1.0;
  res_2.m_data._8_8_ = res_2.m_data._8_8_ & 0xffffffff00000000;
  res_1.m_data._0_8_ = &DAT_3f8000003f800000;
  res_1.m_data._8_8_ = res_1.m_data._8_8_ & 0xffffffff00000000;
  sglr::drawQuad(pCVar8,dVar3,(Vec3 *)&res_2,(Vec3 *)&res_1);
  iVar4 = sglr::ContextWrapper::getWidth(this_00);
  iVar5 = sglr::ContextWrapper::getHeight(this_00);
  FboTestCase::readPixels
            (&this->super_FboTestCase,dst,0,0,iVar4,iVar5,&colorFmt,&colorFmtInfo.lookupScale,
             &colorFmtInfo.lookupBias);
  sglr::ShaderProgram::~ShaderProgram(&flatShader.super_ShaderProgram);
  return;
}

Assistant:

void render (tcu::Surface& dst)
	{
		const deUint32					colorFormat				= GL_RGBA8;
		const deUint32					depthStencilFormat		= GL_DEPTH24_STENCIL8;
		const tcu::TextureFormat		colorFmt				= glu::mapGLInternalFormat(colorFormat);
		const tcu::TextureFormatInfo	colorFmtInfo			= tcu::getTextureFormatInfo(colorFmt);
		const tcu::Vec4&				cBias					= colorFmtInfo.valueMin;
		const tcu::Vec4					cScale					= colorFmtInfo.valueMax-colorFmtInfo.valueMin;
		const bool						isDiscarded				= (m_boundTarget == GL_FRAMEBUFFER) ||
																  (m_invalidateTarget == GL_FRAMEBUFFER && m_boundTarget == GL_DRAW_FRAMEBUFFER) ||
																  (m_invalidateTarget == m_boundTarget);
		const bool						isColorDiscarded		= isDiscarded && hasAttachment(m_invalidateAttachments, GL_COLOR_ATTACHMENT0);
		const bool						isDepthDiscarded		= isDiscarded && (hasAttachment(m_invalidateAttachments, GL_DEPTH_ATTACHMENT) || hasAttachment(m_invalidateAttachments, GL_DEPTH_STENCIL_ATTACHMENT));
		const bool						isStencilDiscarded		= isDiscarded && (hasAttachment(m_invalidateAttachments, GL_STENCIL_ATTACHMENT) || hasAttachment(m_invalidateAttachments, GL_DEPTH_STENCIL_ATTACHMENT));

		deUint32						fbo						= 0;
		deUint32						colorRbo				= 0;
		deUint32						depthStencilRbo			= 0;
		FlatColorShader					flatShader				(glu::TYPE_FLOAT_VEC4);
		deUint32						flatShaderID			= getCurrentContext()->createProgram(&flatShader);

		// Create fbo.
		glGenRenderbuffers		(1, &colorRbo);
		glBindRenderbuffer		(GL_RENDERBUFFER, colorRbo);
		glRenderbufferStorage	(GL_RENDERBUFFER, colorFormat, getWidth(), getHeight());

		glGenRenderbuffers		(1, &depthStencilRbo);
		glBindRenderbuffer		(GL_RENDERBUFFER, depthStencilRbo);
		glRenderbufferStorage	(GL_RENDERBUFFER, depthStencilFormat, getWidth(), getHeight());

		glGenFramebuffers			(1, &fbo);
		glBindFramebuffer			(GL_FRAMEBUFFER, fbo);
		glFramebufferRenderbuffer	(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, colorRbo);
		glFramebufferRenderbuffer	(GL_FRAMEBUFFER, GL_DEPTH_ATTACHMENT, GL_RENDERBUFFER, depthStencilRbo);
		glFramebufferRenderbuffer	(GL_FRAMEBUFFER, GL_STENCIL_ATTACHMENT, GL_RENDERBUFFER, depthStencilRbo);

		checkFramebufferStatus		(GL_FRAMEBUFFER);

		glClearColor	(0.0f, 0.0f, 0.0f, 1.0f);
		glClear			(GL_COLOR_BUFFER_BIT|GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT);

		glEnable		(GL_DEPTH_TEST);
		glEnable		(GL_STENCIL_TEST);
		glStencilOp		(GL_KEEP, GL_KEEP, GL_REPLACE);
		glStencilFunc	(GL_ALWAYS, 1, 0xff);

		flatShader.setColor(*getCurrentContext(), flatShaderID, Vec4(1.0f, 0.0f, 0.0f, 1.0f)*cScale + cBias);
		sglr::drawQuad(*getCurrentContext(), flatShaderID, Vec3(-1.0f, -1.0f, -1.0f), Vec3(1.0f, 1.0f, 1.0f));

		// Bound FBO to test target and default to other
		if (m_boundTarget != GL_FRAMEBUFFER)
		{
			// Dummy fbo is used as complemeting target (read when discarding draw for example).
			// \note Framework takes care of deleting objects at the end of test case.
			const deUint32	dummyTarget		= m_boundTarget == GL_DRAW_FRAMEBUFFER ?  GL_READ_FRAMEBUFFER : GL_DRAW_FRAMEBUFFER;
			deUint32		dummyFbo		= 0;
			deUint32		dummyColorRbo	= 0;

			glGenRenderbuffers			(1, &dummyColorRbo);
			glBindRenderbuffer			(GL_RENDERBUFFER, dummyColorRbo);
			glRenderbufferStorage		(GL_RENDERBUFFER, GL_RGBA8, 64, 64);
			glGenFramebuffers			(1, &dummyFbo);
			glBindFramebuffer			(dummyTarget, dummyFbo);
			glFramebufferRenderbuffer	(dummyTarget, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, dummyColorRbo);

			glBindFramebuffer			(m_boundTarget, fbo);
		}

		glInvalidateFramebuffer(m_invalidateTarget, (int)m_invalidateAttachments.size(), m_invalidateAttachments.empty() ? DE_NULL : &m_invalidateAttachments[0]);

		if (m_boundTarget != GL_FRAMEBUFFER)
			glBindFramebuffer(GL_FRAMEBUFFER, fbo);

		if (isColorDiscarded)
		{
			// Color was not preserved - fill with green.
			glDisable(GL_DEPTH_TEST);
			glDisable(GL_STENCIL_TEST);

			flatShader.setColor(*getCurrentContext(), flatShaderID, Vec4(0.0f, 1.0f, 0.0f, 1.0f)*cScale + cBias);
			sglr::drawQuad(*getCurrentContext(), flatShaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(1.0f, 1.0f, 0.0f));

			glEnable(GL_DEPTH_TEST);
			glEnable(GL_STENCIL_TEST);
		}

		if (isDepthDiscarded)
		{
			// Depth was not preserved.
			glDepthFunc(GL_ALWAYS);
		}

		if (!isStencilDiscarded)
		{
			// Stencil was preserved.
			glStencilFunc(GL_EQUAL, 1, 0xff);
		}

		glEnable		(GL_BLEND);
		glBlendFunc		(GL_ONE, GL_ONE);
		glBlendEquation	(GL_FUNC_ADD);

		flatShader.setColor(*getCurrentContext(), flatShaderID, Vec4(0.0f, 0.0f, 1.0f, 1.0f)*cScale + cBias);
		sglr::drawQuad(*getCurrentContext(), flatShaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(1.0f, 1.0f, 0.0f));

		readPixels(dst, 0, 0, getWidth(), getHeight(), colorFmt, colorFmtInfo.lookupScale, colorFmtInfo.lookupBias);
	}